

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void M680X_get_insn_id(cs_struct *handle,cs_insn *insn,uint id)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  
  plVar1 = *(long **)((long)handle->printer_info + 0xf0);
  insn->id = 0x9f;
  lVar11 = -3;
  do {
    if ((plVar1[lVar11 + 0xc] == 0) || (plVar1[lVar11 + 9] == 0)) break;
    if (*(char *)((long)plVar1 + lVar11 + 0x2b) == (char)(id >> 8)) {
      uVar9 = 0x9f;
      iVar10 = (int)plVar1[lVar11 + 0xc];
      if (iVar10 < 1) goto LAB_002637f5;
      iVar10 = iVar10 + -1;
      iVar4 = 0;
      iVar5 = iVar10;
      goto LAB_0026379f;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0);
  if (((id & 0xff00) == 0) &&
     (uVar9 = *(uint *)(*plVar1 + (ulong)id * 4) & 0x1ff, insn->id = uVar9, uVar9 == 0x9f)) {
    lVar11 = 0;
    bVar2 = true;
    do {
      bVar8 = bVar2;
      if (plVar1[lVar11 + 3] == 0) {
        return;
      }
      if (plVar1[lVar11 + 1] == 0) {
        return;
      }
      iVar10 = (int)plVar1[lVar11 + 3];
      if (0 < iVar10) {
        iVar10 = iVar10 + -1;
        iVar4 = 0;
        iVar5 = iVar10;
        do {
          iVar3 = iVar10 / 2;
          uVar9 = *(uint *)(plVar1[lVar11 + 1] + (long)iVar3 * 4);
          uVar7 = uVar9 & 0xff;
          if (uVar7 < (id & 0xff)) {
            iVar4 = iVar3 + 1;
          }
          else {
            if (uVar7 == (id & 0xff)) {
              if (-2 < iVar10) {
                uVar9 = uVar9 >> 8 & 0x1ff;
                goto LAB_002637f5;
              }
              break;
            }
            iVar5 = iVar3 + -1;
          }
          iVar10 = iVar5 + iVar4;
        } while (iVar4 <= iVar5);
      }
      lVar11 = 1;
      bVar2 = false;
    } while (bVar8);
  }
  return;
LAB_0026379f:
  do {
    iVar3 = iVar10 / 2;
    uVar7 = *(uint *)(plVar1[lVar11 + 9] + (long)iVar3 * 4);
    uVar6 = uVar7 & 0xff;
    if (uVar6 < (id & 0xff)) {
      iVar4 = iVar3 + 1;
    }
    else {
      if (uVar6 == (id & 0xff)) {
        if (-2 < iVar10) {
          uVar9 = uVar7 >> 8 & 0x1ff;
        }
        break;
      }
      iVar5 = iVar3 + -1;
    }
    iVar10 = iVar5 + iVar4;
  } while (iVar4 <= iVar5);
LAB_002637f5:
  insn->id = uVar9;
  return;
}

Assistant:

void M680X_get_insn_id(cs_struct *handle, cs_insn *insn, unsigned int id)
{
	const m680x_info *const info = (const m680x_info *)handle->printer_info;
	const cpu_tables *cpu = info->cpu;
	uint8_t insn_prefix = (id >> 8) & 0xff;
	int index;
	int i;

	insn->id = M680X_INS_ILLGL;

	for (i = 0; i < ARR_SIZE(cpu->pageX_prefix); ++i) {
		if (cpu->pageX_table_size[i] == 0 ||
			(cpu->inst_pageX_table[i] == NULL))
			break;

		if (cpu->pageX_prefix[i] == insn_prefix) {
			index = binary_search(cpu->inst_pageX_table[i],
					cpu->pageX_table_size[i], id & 0xff);
			insn->id = (index >= 0) ?
				cpu->inst_pageX_table[i][index].insn :
				M680X_INS_ILLGL;
			return;
		}
	}

	if (insn_prefix != 0)
		return;

	insn->id = cpu->inst_page1_table[id].insn;

	if (insn->id != M680X_INS_ILLGL)
		return;

	// Check if opcode byte is present in an overlay table
	for (i = 0; i < ARR_SIZE(cpu->overlay_table_size); ++i) {
		if (cpu->overlay_table_size[i] == 0 ||
			(cpu->inst_overlay_table[i] == NULL))
			break;

		if ((index = binary_search(cpu->inst_overlay_table[i],
						cpu->overlay_table_size[i],
						id & 0xff)) >= 0) {
			insn->id = cpu->inst_overlay_table[i][index].insn;
			return;
		}
	}
}